

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellReissner4::ComputeKRMmatricesGlobal
          (ChElementShellReissner4 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor
          )

{
  Scalar SVar1;
  undefined1 auVar2 [16];
  Scalar *pSVar3;
  Scalar *pSVar4;
  int i;
  long row;
  int j;
  long col;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value == 0x18) &&
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == 0x18)) {
    ComputeMassMatrix(this);
    ComputeInternalJacobians(this,Kfactor,Rfactor);
    for (row = 0; row != 0x18; row = row + 1) {
      for (col = 0; col != 0x18; col = col + 1) {
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1> *)
                            &this->m_JacobianMatrix,row,col);
        SVar1 = *pSVar3;
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1> *)
                            &this->m_MassMatrix,row,col);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = Mfactor;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = SVar1;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *pSVar3;
        auVar2 = vfmadd231sd_fma(auVar6,auVar5,auVar2);
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                               *)H,row,col);
        *pSVar4 = auVar2._0_8_;
      }
    }
    return;
  }
  __assert_fail("(H.rows() == 24) && (H.cols() == 24)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementShellReissner4.cpp"
                ,0x268,
                "virtual void chrono::fea::ChElementShellReissner4::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
               );
}

Assistant:

void ChElementShellReissner4::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 24) && (H.cols() == 24));

    // Calculate the mass matrix
    ComputeMassMatrix();

    // Calculate the linear combination Kfactor*[K] + Rfactor*[R]
    ComputeInternalJacobians(Kfactor, Rfactor);

    // Load Jac + Mfactor*[M] into H
    for (int i = 0; i < 24; i++)
        for (int j = 0; j < 24; j++)
            H(i, j) = m_JacobianMatrix(i, j) + Mfactor * m_MassMatrix(i, j);
}